

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall
Graph::createCapacitorType(Graph *this,int id,double reactive_power,double cost_per_KVAr,int step)

{
  const_iterator __position;
  ostream *poVar1;
  Capacitor local_48;
  
  std::operator<<((ostream *)&std::cout,"Capacitor Created with pot: ");
  poVar1 = std::ostream::_M_insert<double>(reactive_power / (this->PB * 1000.0));
  std::endl<char,std::char_traits<char>>(poVar1);
  __position._M_current =
       (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
       super__Vector_impl_data._M_start;
  Capacitor::Capacitor
            (&local_48,id,reactive_power / (this->PB * 1000.0),cost_per_KVAr * reactive_power,0);
  std::vector<Capacitor,_std::allocator<Capacitor>_>::_M_insert_rval
            (&this->capacitorType,__position,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_48.powerSteps.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Graph::createCapacitorType(int id, double reactive_power, double cost_per_KVAr, int step){
    cout << "Capacitor Created with pot: " << reactive_power/(PB*1000) << endl;
    double cost = cost_per_KVAr * reactive_power;
    this->capacitorType.insert( this->capacitorType.begin(), Capacitor( id, reactive_power/(PB*1000), cost ) );
}